

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_lore_blow(parser *p)

{
  _Bool _Var1;
  void *pvVar2;
  char *pcVar3;
  blow_method *pbVar4;
  long lVar5;
  random_conflict rVar6;
  monster_blow *b;
  undefined1 local_50 [8];
  monster_blow *local_48;
  random dam;
  wchar_t index;
  wchar_t seen;
  blow_effect *effect;
  blow_method *method;
  monster_lore *l;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  _index = (blow_effect *)0x0;
  dam.m_bonus = 0;
  dam.sides = 0;
  memset(&local_48,0,0x10);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  else {
    pcVar3 = parser_getsym(p,"method");
    pbVar4 = findmeth(pcVar3);
    if (pbVar4 == (blow_method *)0x0) {
      p_local._4_4_ = PARSE_ERROR_UNRECOGNISED_BLOW;
    }
    else {
      _Var1 = parser_hasval(p,"effect");
      if (_Var1) {
        pcVar3 = parser_getsym(p,"effect");
        _index = findeff(pcVar3);
        if (_index == (blow_effect *)0x0) {
          return PARSE_ERROR_INVALID_EFFECT;
        }
      }
      _Var1 = parser_hasval(p,"damage");
      if (_Var1) {
        rVar6 = parser_getrand(p,"damage");
        b = rVar6._0_8_;
        local_48 = b;
        local_50 = rVar6._8_8_;
        dam.base = local_50._0_4_;
        dam.dice = local_50._4_4_;
      }
      _Var1 = parser_hasval(p,"seen");
      if (_Var1) {
        dam.m_bonus = parser_getint(p,"seen");
      }
      _Var1 = parser_hasval(p,"index");
      if (_Var1) {
        dam.sides = parser_getint(p,"index");
      }
      if (dam.sides < (int)(uint)z_info->mon_blows_max) {
        if (dam.m_bonus != 0) {
          lVar5 = *(long *)((long)pvVar2 + 0x18) + (long)dam.sides * 0x30;
          *(blow_method **)(lVar5 + 8) = pbVar4;
          *(blow_effect **)(lVar5 + 0x10) = _index;
          *(monster_blow **)(lVar5 + 0x18) = local_48;
          *(undefined8 *)(lVar5 + 0x20) = dam._0_8_;
          *(int *)(lVar5 + 0x28) = dam.m_bonus;
        }
        p_local._4_4_ = PARSE_ERROR_NONE;
      }
      else {
        p_local._4_4_ = PARSE_ERROR_TOO_MANY_ENTRIES;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_lore_blow(struct parser *p) {
	struct monster_lore *l = parser_priv(p);
	struct blow_method *method = NULL;
	struct blow_effect *effect = NULL;
	int seen = 0, index = 0;
	struct random dam = { 0, 0, 0, 0 };

	if (!l)
		return PARSE_ERROR_NONE;

	/* Read in all the data */
	method = findmeth(parser_getsym(p, "method"));
	if (!method)
		return PARSE_ERROR_UNRECOGNISED_BLOW;
	if (parser_hasval(p, "effect")) {
		effect = findeff(parser_getsym(p, "effect"));
		if (!effect)
			return PARSE_ERROR_INVALID_EFFECT;
	}
	if (parser_hasval(p, "damage"))
		dam = parser_getrand(p, "damage");
	if (parser_hasval(p, "seen"))
		seen = parser_getint(p, "seen");
	if (parser_hasval(p, "index"))
		index = parser_getint(p, "index");
	if (index >= z_info->mon_blows_max)
		return PARSE_ERROR_TOO_MANY_ENTRIES;

	/* Interpret */
	if (seen) {
		struct monster_blow *b = &l->blows[index];
		b->method = method;
		b->effect = effect;
		b->dice = dam;
		b->times_seen = seen;
	}

	return PARSE_ERROR_NONE;
}